

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GPUShaderFP64Test2::verifyResults(GPUShaderFP64Test2 *this,shaderStage shader_stage)

{
  ulong uVar1;
  ostringstream *poVar2;
  long lVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  pointer piVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  vector<int,_std::allocator<int>_> image_data;
  undefined1 local_1a8 [384];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  if (shader_stage < GEOMETRY_SHADER) {
    image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize(&image_data,0x400);
    (**(code **)(lVar8 + 0xb8))(0xde1,this->m_texture_id);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x11c4);
    (**(code **)(lVar8 + 0xaa0))
              (0xde1,0,0x8d94,0x1404,
               image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x11c7);
    piVar6 = image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar9 = 0; uVar9 != 0x20; uVar9 = uVar9 + 1) {
      for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 1) {
        if (piVar6[lVar8] != 1) {
          bVar10 = 0x1f < uVar9;
          local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar2 = (ostringstream *)(local_1a8 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::operator<<((ostream *)poVar2,"Error. Texture contents are wrong at (");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::operator<<((ostream *)poVar2,", ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::operator<<((ostream *)poVar2,")");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          goto LAB_009da75e;
        }
      }
      piVar6 = piVar6 + 0x20;
    }
    bVar10 = true;
LAB_009da75e:
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&image_data.super__Vector_base<int,_std::allocator<int>_>);
  }
  else {
    (**(code **)(lVar8 + 0x40))(0x8c8e,this->m_transform_feedback_buffer_id);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x11e5);
    lVar7 = (**(code **)(lVar8 + 0xcf8))(0x8c8e,35000);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"MapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x11e8);
    uVar9 = 0xffffffffffffffff;
    do {
      if (uVar9 == 0x3ff) {
        bVar10 = true;
        goto LAB_009da76b;
      }
      uVar1 = uVar9 + 1;
      lVar3 = uVar9 * 4;
      uVar9 = uVar1;
    } while (*(int *)(lVar7 + 4 + lVar3) == 1);
    bVar10 = 0x3ff < uVar1;
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar2 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Error. Transform feedback buffer contents are wrong at ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
LAB_009da76b:
    (**(code **)(lVar8 + 0x1670))(0x8c8e);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"UnmapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x11fb);
  }
  return bVar10;
}

Assistant:

bool GPUShaderFP64Test2::verifyResults(shaderStage shader_stage) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if ((FRAGMENT_SHADER == shader_stage) || (COMPUTE_SHADER == shader_stage))
	{
		/* Verify contents of texture */

		/* Prepare storage for testure data */
		std::vector<glw::GLint> image_data;
		image_data.resize(m_texture_width * m_texture_height);

		/* Get texture contents */
		gl.bindTexture(GL_TEXTURE_2D, m_texture_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.getTexImage(GL_TEXTURE_2D, 0 /* level */, GL_RED_INTEGER, GL_INT, &image_data[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexImage");

		for (glw::GLuint y = 0; y < m_texture_width; ++y)
		{
			for (glw::GLuint x = 0; x < m_texture_height; ++x)
			{
				const glw::GLuint offset = y * m_texture_width + x;
				const glw::GLint  value  = image_data[offset];

				if (m_result_success != value)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Error. Texture contents are wrong at (" << x << ", " << y << ")"
						<< tcu::TestLog::EndMessage;

					return false;
				}
			}
		}

		return true;
	}
	else
	{
		/* Verify contents of transform feedback buffer */

		bool result = true;

		/* Get transform feedback data */
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_transform_feedback_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

		glw::GLint* feedback_data = (glw::GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

		for (glw::GLuint i = 0; i < m_n_captured_results; ++i)
		{
			const glw::GLint value = feedback_data[i];

			if (m_result_success != value)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "Error. Transform feedback buffer contents are wrong at " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}

		/* Unmap transform feedback buffer */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

		return result;
	}
}